

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O0

Pass * wasm::createGenerateGlobalEffectsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  GenerateGlobalEffects::GenerateGlobalEffects((GenerateGlobalEffects *)this);
  return this;
}

Assistant:

Pass* createGenerateGlobalEffectsPass() { return new GenerateGlobalEffects(); }